

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O3

void keep_one_mv_stat(MV_STATS *mv_stats,MV *ref_mv,MV *cur_mv,AV1_COMP *cpi)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  short sVar9;
  bool bVar10;
  byte bVar11;
  ulong uVar12;
  byte bVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ushort *puVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  short in_R8W;
  ushort uVar26;
  ushort uVar27;
  uint uVar28;
  long lVar29;
  long in_R9;
  ushort uVar30;
  int iVar31;
  ushort uVar32;
  long lVar33;
  ushort *puVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  bool bVar39;
  byte in_stack_00000008;
  
  uVar14 = (short)cpi - (short)ref_mv;
  uVar26 = in_R8W - (short)cur_mv;
  bVar11 = (uVar14 != 0) * '\x02' | uVar26 != 0;
  uVar32 = uVar26;
  uVar30 = uVar14;
  if ((in_stack_00000008 & 1) != 0) {
    uVar32 = uVar26 - ((short)uVar26 >> 0xf) & 0xfffe;
    uVar30 = uVar14 - ((short)uVar14 >> 0xf) & 0xfffe;
  }
  uVar28 = (uint)(uVar26 != 0) + (uint)(uVar14 != 0) * 2;
  uVar12 = (ulong)bVar11;
  uVar15 = 0;
  uVar35 = 0;
  if (bVar11 != 0) {
    uVar35 = (uint)(ushort)(0x8000 - *(short *)(in_R9 + 0x2e86 + uVar12 * 2));
  }
  uVar35 = (-(uint)*(ushort *)(in_R9 + 0x2e88 + uVar12 * 2) - 0x8000 & 0xffff) - uVar35;
  if ((int)uVar35 < 5) {
    uVar35 = 4;
  }
  if (0x7ffe < (uVar35 & 0xffff)) {
    uVar35 = 0x7fff;
  }
  uVar35 = uVar35 & 0xffff;
  uVar16 = 0x1f;
  if (uVar35 != 0) {
    for (; uVar35 >> uVar16 == 0; uVar16 = uVar16 - 1) {
    }
  }
  uVar35 = uVar35 << ((byte)(~uVar16 + 0xf) & 0x1f);
  uVar22 = (uint)(uVar32 != 0) + (uint)(uVar30 != 0) * 2;
  uVar23 = (uint)((ulong)uVar35 * 0x100 + 0x4000 >> 0xf);
  if (uVar28 != 0) {
    uVar15 = (uint)(ushort)(0x8000 - *(short *)(in_R9 + 0x2e86 + (ulong)uVar28 * 2));
  }
  uVar15 = (-(uint)*(ushort *)(in_R9 + 0x2e88 + (ulong)uVar28 * 2) - 0x8000 & 0xffff) - uVar15;
  uVar28 = 4;
  if (4 < (int)uVar15) {
    uVar28 = uVar15;
  }
  if (0x7ffe < (uVar28 & 0xffff)) {
    uVar28 = 0x7fff;
  }
  uVar28 = uVar28 & 0xffff;
  uVar15 = 0x1f;
  if (uVar28 != 0) {
    for (; uVar28 >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  uVar28 = uVar28 << ((byte)(~uVar15 + 0xf) & 0x1f);
  uVar2 = *(ushort *)
           (block_size_high +
           (ulong)((uVar35 < 0x40 | uVar23 | 0xff - uVar23 >> 0x17) & 0xff) * 2 + 0x10);
  uVar35 = (uint)((ulong)uVar28 * 0x100 + 0x4000 >> 0xf);
  uVar27 = *(ushort *)
            (block_size_high +
            (ulong)((uVar28 < 0x40 | uVar35 | 0xff - uVar35 >> 0x17) & 0xff) * 2 + 0x10);
  if (uVar22 == 0) {
    uVar35 = 0;
  }
  else {
    uVar35 = (uint)(ushort)(0x8000 - *(short *)(in_R9 + 0x2e86 + (ulong)uVar22 * 2));
  }
  uVar35 = (-(uint)*(ushort *)(in_R9 + 0x2e88 + (ulong)uVar22 * 2) - 0x8000 & 0xffff) - uVar35;
  uVar28 = 4;
  if (4 < (int)uVar35) {
    uVar28 = uVar35;
  }
  if (0x7ffe < (uVar28 & 0xffff)) {
    uVar28 = 0x7fff;
  }
  uVar28 = uVar28 & 0xffff;
  uVar35 = 0x1f;
  if (uVar28 != 0) {
    for (; uVar28 >> uVar35 == 0; uVar35 = uVar35 - 1) {
    }
  }
  uVar28 = uVar28 << ((byte)(~uVar35 + 0xf) & 0x1f);
  uVar22 = (uint)((ulong)uVar28 * 0x100 + 0x4000 >> 0xf);
  uVar3 = *(ushort *)
           (block_size_high +
           (ulong)((uVar28 < 0x40 | uVar22 | 0xff - uVar22 >> 0x17) & 0xff) * 2 + 0x10);
  uVar4 = *(ushort *)(in_R9 + 0x2e90);
  bVar11 = (char)(uVar4 >> 4) + 5;
  uVar24 = 0;
  do {
    uVar5 = *(ushort *)(in_R9 + 0x2e88 + uVar24 * 2);
    if (uVar24 < uVar12) {
      sVar9 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar11 & 0x1f));
    }
    else {
      sVar9 = -(uVar5 >> (bVar11 & 0x1f));
    }
    *(ushort *)(in_R9 + 0x2e88 + uVar24 * 2) = sVar9 + uVar5;
    uVar24 = uVar24 + 1;
  } while (uVar24 != 3);
  *(short *)(in_R9 + 0x2e90) = *(short *)(in_R9 + 0x2e90) + (ushort)(uVar4 < 0x20);
  iVar36 = (~uVar16 + 0xf) * 0x200 + (uint)uVar2 + mv_stats->total_mv_rate;
  iVar20 = (~uVar15 + 0xf) * 0x200 + (uint)uVar27 + mv_stats->hp_total_mv_rate;
  iVar19 = (~uVar35 + 0xf) * 0x200 + (uint)uVar3 + mv_stats->lp_total_mv_rate;
  mv_stats->mv_joint_count[uVar12] = mv_stats->mv_joint_count[uVar12] + 1;
  lVar33 = 0;
  bVar39 = true;
  do {
    bVar10 = bVar39;
    uVar2 = uVar26;
    uVar27 = uVar32;
    if (bVar10) {
      uVar2 = uVar14;
      uVar27 = uVar30;
    }
    iVar37 = 0;
    iVar21 = 0;
    iVar31 = 0;
    if (uVar2 != 0) {
      uVar15 = (uint)(short)uVar2;
      uVar35 = -uVar15;
      if (0 < (int)uVar15) {
        uVar35 = uVar15;
      }
      uVar16 = uVar35 - 1;
      uVar28 = 0x1f;
      if ((int)uVar16 >> 3 != 0) {
        for (; (uint)((int)uVar16 >> 3) >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar22 = 0;
      uVar12 = (ulong)uVar28;
      if (uVar35 < 9) {
        uVar12 = 0;
      }
      bVar11 = (byte)uVar12;
      lVar33 = lVar33 * 0x8a;
      uVar28 = -8 << (bVar11 & 0x1f);
      if (bVar11 == 0) {
        uVar28 = uVar22;
      }
      uVar35 = (uVar28 - 1) + uVar35;
      lVar1 = in_R9 + 0x2ed4;
      if (bVar11 == 0) {
        lVar1 = in_R9 + 0x2ece;
      }
      puVar18 = (ushort *)(lVar1 + lVar33);
      uVar28 = (int)uVar35 >> 3;
      lVar1 = in_R9 + 0x2e92 + lVar33;
      lVar29 = (long)(int)uVar28;
      lVar38 = lVar1 + 0x18 + lVar29 * 10;
      if (bVar11 != 0) {
        lVar38 = in_R9 + 0x2ebe + lVar33;
      }
      if ((short)uVar2 < 0) {
        uVar22 = (uint)(ushort)(0x8000 - *(short *)(lVar1 + 0x34 + (ulong)(uVar15 >> 0x1f) * 2));
      }
      uVar22 = (-(uint)*(ushort *)(lVar1 + 0x36 + (ulong)(uVar15 >> 0x1f) * 2) - 0x8000 & 0xffff) -
               uVar22;
      if ((int)uVar22 < 5) {
        uVar22 = 4;
      }
      if (0x7ffe < (uVar22 & 0xffff)) {
        uVar22 = 0x7fff;
      }
      uVar22 = uVar22 & 0xffff;
      uVar15 = 0x1f;
      if (uVar22 != 0) {
        for (; uVar22 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar22 = uVar22 << ((byte)(~uVar15 + 0xf) & 0x1f);
      uVar3 = *(ushort *)(lVar1 + 0x3a);
      bVar13 = (char)(uVar3 >> 4) + 4;
      uVar4 = *(ushort *)(lVar1 + 0x36);
      if ((short)uVar2 < 0) {
        sVar9 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar13 & 0x1f));
      }
      else {
        sVar9 = -(uVar4 >> (bVar13 & 0x1f));
      }
      uVar23 = (uint)((ulong)uVar22 * 0x100 + 0x4000 >> 0xf);
      uVar5 = *(ushort *)
               (block_size_high +
               (ulong)((uVar22 < 0x40 | uVar23 | 0xff - uVar23 >> 0x17) & 0xff) * 2 + 0x10);
      *(ushort *)(lVar1 + 0x36) = uVar4 + sVar9;
      *(ushort *)(lVar1 + 0x3a) = uVar3 + (uVar3 < 0x20);
      uVar12 = uVar12 & 0xff;
      if (bVar11 == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = (uint)(ushort)(0x8000 - *(short *)(lVar1 + -2 + uVar12 * 2));
      }
      uVar23 = uVar16 >> 1 & 3;
      uVar16 = uVar16 & 1;
      uVar22 = (-(uint)*(ushort *)(lVar1 + uVar12 * 2) - 0x8000 & 0xffff) - uVar22;
      if ((int)uVar22 < 5) {
        uVar22 = 4;
      }
      if (0x7ffe < (uVar22 & 0xffff)) {
        uVar22 = 0x7fff;
      }
      uVar22 = uVar22 & 0xffff;
      uVar8 = 0x1f;
      if (uVar22 != 0) {
        for (; uVar22 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar22 = uVar22 << ((byte)(~uVar8 + 0xf) & 0x1f);
      uVar17 = (uint)((ulong)uVar22 * 0x100 + 0x4000 >> 0xf);
      uVar3 = *(ushort *)
               (block_size_high +
               (ulong)((uVar22 < 0x40 | uVar17 | 0xff - uVar17 >> 0x17) & 0xff) * 2 + 0x10);
      uVar4 = *(ushort *)(lVar1 + 0x16);
      bVar13 = (char)(uVar4 >> 4) + 5;
      uVar24 = 0;
      do {
        uVar6 = *(ushort *)(lVar1 + uVar24 * 2);
        if (uVar24 < uVar12) {
          sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar13 & 0x1f));
        }
        else {
          sVar9 = -(uVar6 >> (bVar13 & 0x1f));
        }
        *(ushort *)(lVar1 + uVar24 * 2) = sVar9 + uVar6;
        uVar24 = uVar24 + 1;
      } while (uVar24 != 10);
      *(short *)(lVar1 + 0x16) = *(short *)(lVar1 + 0x16) + (ushort)(uVar4 < 0x20);
      if (bVar11 == 0) {
        uVar22 = 0;
        if (7 < uVar35) {
          uVar22 = (uint)(ushort)(0x8000 - *(short *)(lVar1 + 0x46 + lVar29 * 2));
        }
        uVar22 = (-(uint)*(ushort *)(lVar1 + 0x48 + lVar29 * 2) - 0x8000 & 0xffff) - uVar22;
        if ((int)uVar22 < 5) {
          uVar22 = 4;
        }
        if (0x7ffe < (uVar22 & 0xffff)) {
          uVar22 = 0x7fff;
        }
        uVar22 = uVar22 & 0xffff;
        uVar35 = 0x1f;
        if (uVar22 != 0) {
          for (; uVar22 >> uVar35 == 0; uVar35 = uVar35 - 1) {
          }
        }
        uVar22 = uVar22 << ((byte)(~uVar35 + 0xf) & 0x1f);
        uVar4 = *(ushort *)(lVar1 + 0x4c);
        bVar11 = (char)(uVar4 >> 4) + 4;
        uVar6 = *(ushort *)(lVar1 + 0x48);
        if ((char)uVar28 < '\x01') {
          sVar9 = -(uVar6 >> (bVar11 & 0x1f));
        }
        else {
          sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar11 & 0x1f));
        }
        uVar28 = (uint)((ulong)uVar22 * 0x100 + 0x4000 >> 0xf);
        iVar21 = (~uVar35 + 0xf) * 0x200 +
                 (uint)*(ushort *)
                        (block_size_high +
                        (ulong)((uVar22 < 0x40 | uVar28 | 0xff - uVar28 >> 0x17) & 0xff) * 2 + 0x10)
        ;
        *(ushort *)(lVar1 + 0x48) = sVar9 + uVar6;
        *(ushort *)(lVar1 + 0x4c) = uVar4 + (uVar4 < 0x20);
      }
      else {
        puVar34 = (ushort *)(lVar33 + in_R9 + 0x2ee4);
        uVar24 = 0;
        iVar21 = 0;
        do {
          bVar39 = (uVar28 >> ((uint)uVar24 & 0x1f) & 1) != 0;
          uVar25 = (ulong)bVar39;
          uVar35 = 0;
          if (bVar39) {
            uVar35 = (uint)(ushort)(0x8000 - puVar34[uVar25 - 3]);
          }
          uVar35 = (-(uint)puVar34[uVar25 - 2] - 0x8000 & 0xffff) - uVar35;
          if ((int)uVar35 < 5) {
            uVar35 = 4;
          }
          if (0x7ffe < (uVar35 & 0xffff)) {
            uVar35 = 0x7fff;
          }
          uVar35 = uVar35 & 0xffff;
          uVar22 = 0x1f;
          if (uVar35 != 0) {
            for (; uVar35 >> uVar22 == 0; uVar22 = uVar22 - 1) {
            }
          }
          uVar35 = uVar35 << ((byte)(~uVar22 + 0xf) & 0x1f);
          uVar4 = *puVar34;
          bVar11 = (char)(uVar4 >> 4) + 4;
          uVar6 = puVar34[-2];
          if (uVar25 == 0) {
            sVar9 = -(uVar6 >> (bVar11 & 0x1f));
          }
          else {
            sVar9 = (short)((int)(0x8000 - (uint)uVar6) >> (bVar11 & 0x1f));
          }
          uVar17 = (uint)((ulong)uVar35 * 0x100 + 0x4000 >> 0xf);
          iVar21 = iVar21 + (~uVar22 + 0xf) * 0x200 +
                   (uint)*(ushort *)
                          (block_size_high +
                          (ulong)((uVar35 < 0x40 | uVar17 | 0xff - uVar17 >> 0x17) & 0xff) * 2 +
                          0x10);
          puVar34[-2] = sVar9 + uVar6;
          *puVar34 = uVar4 + (uVar4 < 0x20);
          uVar24 = uVar24 + 1;
          puVar34 = puVar34 + 3;
        } while (uVar12 != uVar24);
      }
      uVar12 = (ulong)uVar23;
      if (uVar23 == 0) {
        uVar35 = 0;
      }
      else {
        uVar35 = (uint)(ushort)(0x8000 - *(short *)(lVar38 + -2 + uVar12 * 2));
      }
      uVar35 = (-(uint)*(ushort *)(lVar38 + uVar12 * 2) - 0x8000 & 0xffff) - uVar35;
      if ((int)uVar35 < 5) {
        uVar35 = 4;
      }
      if (0x7ffe < (uVar35 & 0xffff)) {
        uVar35 = 0x7fff;
      }
      uVar35 = uVar35 & 0xffff;
      uVar28 = 0x1f;
      if (uVar35 != 0) {
        for (; uVar35 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar35 = uVar35 << ((byte)(~uVar28 + 0xf) & 0x1f);
      uVar22 = (uint)((ulong)uVar35 * 0x100 + 0x4000 >> 0xf);
      uVar4 = *(ushort *)
               (block_size_high +
               (ulong)((uVar35 < 0x40 | uVar22 | 0xff - uVar22 >> 0x17) & 0xff) * 2 + 0x10);
      uVar6 = *(ushort *)(lVar38 + 8);
      bVar11 = (char)(uVar6 >> 4) + 5;
      uVar24 = 0;
      do {
        uVar7 = *(ushort *)(lVar38 + uVar24 * 2);
        if (uVar24 < uVar12) {
          sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar11 & 0x1f));
        }
        else {
          sVar9 = -(uVar7 >> (bVar11 & 0x1f));
        }
        *(ushort *)(lVar38 + uVar24 * 2) = sVar9 + uVar7;
        uVar24 = uVar24 + 1;
      } while (uVar24 != 3);
      *(short *)(lVar38 + 8) = *(short *)(lVar38 + 8) + (ushort)(uVar6 < 0x20);
      iVar37 = 0;
      if ((in_stack_00000008 & 1) != 0) {
        uVar35 = 0;
        if (uVar16 != 0) {
          uVar35 = (uint)(ushort)(0x8000 - puVar18[(ulong)uVar16 - 1]);
        }
        uVar35 = (-(uint)puVar18[uVar16] - 0x8000 & 0xffff) - uVar35;
        if ((int)uVar35 < 5) {
          uVar35 = 4;
        }
        if (0x7ffe < (uVar35 & 0xffff)) {
          uVar35 = 0x7fff;
        }
        uVar35 = uVar35 & 0xffff;
        uVar22 = 0x1f;
        if (uVar35 != 0) {
          for (; uVar35 >> uVar22 == 0; uVar22 = uVar22 - 1) {
          }
        }
        uVar35 = uVar35 << ((byte)(~uVar22 + 0xf) & 0x1f);
        uVar6 = puVar18[2];
        bVar11 = (char)(uVar6 >> 4) + 4;
        uVar7 = *puVar18;
        if (uVar16 == 0) {
          sVar9 = -(uVar7 >> (bVar11 & 0x1f));
        }
        else {
          sVar9 = (short)((int)(0x8000 - (uint)uVar7) >> (bVar11 & 0x1f));
        }
        uVar23 = (uint)((ulong)uVar35 * 0x100 + 0x4000 >> 0xf);
        iVar37 = (~uVar22 + 0xf) * 0x200 +
                 (uint)*(ushort *)
                        (block_size_high +
                        (ulong)((uVar35 < 0x40 | uVar23 | 0xff - uVar23 >> 0x17) & 0xff) * 2 + 0x10)
        ;
        *puVar18 = uVar7 + sVar9;
        puVar18[2] = uVar6 + (uVar6 < 0x20);
      }
      mv_stats->last_bit_zero = mv_stats->last_bit_zero + (uVar16 ^ 1);
      mv_stats->last_bit_nonzero = mv_stats->last_bit_nonzero + uVar16;
      iVar31 = (~uVar8 + 0xf) * 0x200 + (uint)uVar3 + (~uVar15 + 0xf) * 0x200 + (uint)uVar5 + iVar21
               + (~uVar28 + 0xf) * 0x200 + (uint)uVar4;
      iVar21 = iVar31 + iVar37;
    }
    iVar37 = iVar37 + iVar31;
    if (uVar2 == 0) {
      iVar37 = 0;
    }
    if (uVar27 == 0) {
      iVar31 = 0;
    }
    iVar36 = iVar36 + iVar21;
    iVar20 = iVar20 + iVar37;
    iVar19 = iVar19 + iVar31;
    lVar33 = 1;
    bVar39 = false;
  } while (bVar10);
  mv_stats->total_mv_rate = iVar36;
  mv_stats->hp_total_mv_rate = iVar20;
  mv_stats->lp_total_mv_rate = iVar19;
  return;
}

Assistant:

static inline void keep_one_mv_stat(MV_STATS *mv_stats, const MV *ref_mv,
                                    const MV *cur_mv, const AV1_COMP *cpi) {
  const MACROBLOCK *const x = &cpi->td.mb;
  const MACROBLOCKD *const xd = &x->e_mbd;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  nmv_context *nmvc = &ec_ctx->nmvc;
  aom_cdf_prob *joint_cdf = nmvc->joints_cdf;
  const int use_hp = cpi->common.features.allow_high_precision_mv;

  const MV diff = { cur_mv->row - ref_mv->row, cur_mv->col - ref_mv->col };
  const int mv_joint = av1_get_mv_joint(&diff);
  // TODO(chiyotsai@google.com): Estimate hp_diff when we are using lp
  const MV hp_diff = diff;
  const int hp_mv_joint = av1_get_mv_joint(&hp_diff);
  const MV truncated_diff = { (diff.row / 2) * 2, (diff.col / 2) * 2 };
  const MV lp_diff = use_hp ? truncated_diff : diff;
  const int lp_mv_joint = av1_get_mv_joint(&lp_diff);

  const int mv_joint_rate = get_symbol_cost(joint_cdf, mv_joint);
  const int hp_mv_joint_rate = get_symbol_cost(joint_cdf, hp_mv_joint);
  const int lp_mv_joint_rate = get_symbol_cost(joint_cdf, lp_mv_joint);

  update_cdf(joint_cdf, mv_joint, MV_JOINTS);

  mv_stats->total_mv_rate += mv_joint_rate;
  mv_stats->hp_total_mv_rate += hp_mv_joint_rate;
  mv_stats->lp_total_mv_rate += lp_mv_joint_rate;
  mv_stats->mv_joint_count[mv_joint]++;

  for (int comp_idx = 0; comp_idx < 2; comp_idx++) {
    const int comp_val = comp_idx ? diff.col : diff.row;
    const int hp_comp_val = comp_idx ? hp_diff.col : hp_diff.row;
    const int lp_comp_val = comp_idx ? lp_diff.col : lp_diff.row;
    int rates[5];
    av1_zero_array(rates, 5);

    const int comp_rate =
        comp_val ? keep_one_comp_stat(mv_stats, comp_val, comp_idx, cpi, rates)
                 : 0;
    // TODO(chiyotsai@google.com): Properly get hp rate when use_hp is false
    const int hp_rate =
        hp_comp_val ? rates[0] + rates[1] + rates[2] + rates[3] + rates[4] : 0;
    const int lp_rate =
        lp_comp_val ? rates[0] + rates[1] + rates[2] + rates[3] : 0;

    mv_stats->total_mv_rate += comp_rate;
    mv_stats->hp_total_mv_rate += hp_rate;
    mv_stats->lp_total_mv_rate += lp_rate;
  }
}